

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O1

void __thiscall
Random_keys::cruzamento4
          (Random_keys *this,RK_Individual *pai1,RK_Individual *pai2,RK_Individual *filho)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  pointer ppCVar4;
  pointer __last;
  unsigned_long i;
  ulong uVar5;
  ulong uVar6;
  RK_Individual *pRVar7;
  ulong uVar8;
  double dVar9;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  __last = RK_Individual::cromossomos.
           super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppCVar4 = RK_Individual::cromossomos.
            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = time((time_t *)0x0);
  local_38._M_x = uVar5 % 0x7fffffff + (ulong)(uVar5 % 0x7fffffff == 0);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )ppCVar4,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )__last,&local_38);
  ppCVar4 = RK_Individual::cromossomos.
            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (long)RK_Individual::cromossomos.
                super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)RK_Individual::cromossomos.
                super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  dVar9 = round((double)(int)uVar5 * 0.8);
  pRVar7 = pai1;
  if (pai1->active_loss < pai2->active_loss) {
    pRVar7 = pai2;
  }
  uVar6 = (ulong)(int)dVar9;
  if ((int)dVar9 != 0) {
    if (pai1->active_loss < pai2->active_loss) {
      pai2 = pai1;
    }
    uVar8 = 0;
    do {
      if (uVar5 == uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                   ,uVar5);
      }
      iVar1 = ppCVar4[uVar8]->position;
      filho->weights[iVar1] = pai2->weights[iVar1];
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < uVar5) {
    pdVar2 = pRVar7->weights;
    pdVar3 = filho->weights;
    do {
      iVar1 = ppCVar4[uVar6]->position;
      pdVar3[iVar1] = pdVar2[iVar1];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  return;
}

Assistant:

void Random_keys::cruzamento4(RK_Individual *pai1, RK_Individual *pai2, RK_Individual *filho) {
    shuffle(RK_Individual::cromossomos.begin(), RK_Individual::cromossomos.end(), std::default_random_engine(time(NULL)));

    int tam = RK_Individual::cromossomos.size();

    int tamMelhor = round(0.8*tam);

    RK_Individual *melhorPai = pai2, *piorPai = pai1;
    if(pai1->getActiveLoss()<pai2->getActiveLoss()){
        melhorPai = pai1;
        piorPai = pai2;
    }

    //80% vem do melhor pai
    for(unsigned long int i=0; i<tamMelhor; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = melhorPai->getWeights()[RK_Individual::cromossomos.at(i)->position];

    //20% vem do pior pai
    for(unsigned long int i=tamMelhor; i<RK_Individual::cromossomos.size(); i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = piorPai->getWeights()[RK_Individual::cromossomos.at(i)->position];
}